

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wrap.cpp
# Opt level: O2

int C_std::Network::easy_connect(int sockfd,int port,string *ip)

{
  int iVar1;
  allocator local_39;
  string local_38;
  sockaddr local_18;
  
  local_18.sa_data[10] = '\0';
  local_18.sa_data[0xb] = '\0';
  local_18.sa_data[0xc] = '\0';
  local_18.sa_data[0xd] = '\0';
  local_18.sa_data[2] = '\0';
  local_18.sa_data[3] = '\0';
  local_18.sa_data[4] = '\0';
  local_18.sa_data[5] = '\0';
  local_18.sa_data[6] = '\0';
  local_18.sa_data[7] = '\0';
  local_18.sa_data[8] = '\0';
  local_18.sa_data[9] = '\0';
  local_18.sa_family = 2;
  local_18.sa_data._0_2_ = (ushort)port << 8 | (ushort)port >> 8;
  iVar1 = inet_pton(2,(ip->_M_dataplus)._M_p,local_18.sa_data + 2);
  if (iVar1 == -1) {
    std::__cxx11::string::string((string *)&local_38,"af to ip error",&local_39);
    perror_exit(&local_38);
  }
  else {
    if (iVar1 != 0) goto LAB_001041b1;
    std::__cxx11::string::string((string *)&local_38,"ip convert error",&local_39);
    perror_exit(&local_38);
  }
  std::__cxx11::string::~string((string *)&local_38);
LAB_001041b1:
  iVar1 = Connect(sockfd,&local_18,0x10);
  return iVar1;
}

Assistant:

int easy_connect(int sockfd, int port, const std::string ip) {
            struct sockaddr_in addr;
            memset(&addr, 0, sizeof(addr));
            addr.sin_family = AF_INET;
            addr.sin_port = htons(port);
            int ret = inet_pton(AF_INET, ip.c_str(), &addr.sin_addr.s_addr);
            if (ret == 0) {
                perror_exit("ip convert error");    //src不包含代表指定地址族中有效网络地址的字符串
            } else if (ret == -1){
                perror_exit("af to ip error");            //af不包含有效的地址族
            }
            return Connect(sockfd, reinterpret_cast<struct sockaddr *>(&addr), sizeof(addr));
        }